

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cContextFlagsTests.cpp
# Opt level: O1

void __thiscall es32cts::ContextFlagsCase::deinit(ContextFlagsCase *this)

{
  if (this->m_caseContext != (RenderContext *)0x0) {
    (*this->m_caseContext->_vptr_RenderContext[1])();
    this->m_caseContext = (RenderContext *)0x0;
    (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[8])();
    return;
  }
  return;
}

Assistant:

void ContextFlagsCase::deinit(void)
{
	releaseContext();
}